

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

bool __thiscall CppJieba::Trie::_trieInsert(Trie *this,char *filePath)

{
  uint uVar1;
  pointer pcVar2;
  pointer pbVar3;
  pointer pbVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  istream *piVar8;
  pointer pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vecBuf;
  string line;
  TrieNodeInfo nodeInfo;
  ifstream ifile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  string local_2d0;
  Trie *local_2b0;
  string local_2a8;
  undefined1 local_288 [32];
  _Alloc_hider local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  double local_248;
  long local_238 [65];
  
  local_2b0 = this;
  std::ifstream::ifstream(local_238,filePath,_S_in);
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_268._M_p = (pointer)&local_258;
  local_288._16_8_ = (pointer)0x0;
  local_288._24_8_ = 0;
  local_288._0_8_ = (pointer)0x0;
  local_288._8_8_ = (pointer)0x0;
  local_260 = 0;
  local_258._M_local_buf[0] = '\0';
  local_248 = 0.0;
  do {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)local_238);
    piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2a8,cVar5);
    pbVar4 = local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar1 = *(uint *)(piVar8 + *(long *)(*(long *)piVar8 + -0x18) + 0x20);
    if ((uVar1 & 5) != 0) {
LAB_0011097c:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_p != &local_258) {
        operator_delete(local_268._M_p);
      }
      if ((pointer)local_288._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_288._0_8_);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(local_238);
      return (uVar1 & 5) != 0;
    }
    pbVar9 = local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_2e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        pcVar2 = (pbVar9->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar2 != &pbVar9->field_2) {
          operator_delete(pcVar2);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != pbVar4);
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    paVar10 = &local_2d0.field_2;
    local_2d0._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0," ","");
    Limonp::splitStr(&local_2a8,&local_2e8,&local_2d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != paVar10) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    if (0x60 < (ulong)((long)local_2e8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_2e8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      local_2d0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"line[%s] illegal.","");
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x148,&local_2d0,local_2a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar10) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
      goto LAB_0011097c;
    }
    bVar6 = Limonp::utf8ToUnicode
                      (((local_2e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                       (uint)(local_2e8.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_string_length,
                       (vector<unsigned_short,_std::allocator<unsigned_short>_> *)local_288);
    pbVar3 = local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (!bVar6) goto LAB_0011097c;
    iVar7 = atoi(local_2e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    local_288._24_8_ = SEXT48(iVar7);
    if ((long)local_2e8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 == 0x60) {
      std::__cxx11::string::_M_assign((string *)&local_268);
    }
    bVar6 = _insert(local_2b0,(TrieNodeInfo *)local_288);
    if (!bVar6) {
      local_2d0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2d0,"_insert node failed!","");
      Limonp::Logger::LoggingF(3,"Trie.hpp",0x158,&local_2d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d0._M_dataplus._M_p != paVar10) {
        operator_delete(local_2d0._M_dataplus._M_p);
      }
    }
  } while( true );
}

Assistant:

bool _trieInsert(const char * const filePath)
            {
                ifstream ifile(filePath);
                string line;
                vector<string> vecBuf;

                TrieNodeInfo nodeInfo;
                while(getline(ifile, line))
                {
                    vecBuf.clear();
                    splitStr(line, vecBuf, " ");
                    if(3 < vecBuf.size())
                    {
                        LogError("line[%s] illegal.", line.c_str());
                        return false;
                    }
                    if(!TransCode::decode(vecBuf[0], nodeInfo.word))
                    {
                        return false;
                    }
                    nodeInfo.freq = atoi(vecBuf[1].c_str());
                    if(3 == vecBuf.size())
                    {
                        nodeInfo.tag = vecBuf[2];
                    }

                    //_insert node
                    if(!_insert(nodeInfo))
                    {
                        LogError("_insert node failed!");
                    }
                }
                return true;
            }